

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga.c
# Opt level: O1

void xc_gga_sanity_check(xc_func_info_type *info,int order,xc_gga_out_params *out)

{
  long lVar1;
  undefined8 *extraout_RDX;
  long lVar2;
  undefined4 in_register_00000034;
  
  lVar2 = CONCAT44(in_register_00000034,order);
  if ((uint)order < 5) {
    if ((out->zk != (double *)0x0) && ((info->flags & 1) == 0)) goto LAB_001db451;
    if (out->vrho != (double *)0x0) {
      if ((info->flags & 2) == 0) goto LAB_001db456;
      if (out->vsigma != (double *)0x0) goto LAB_001db3e2;
      goto LAB_001db45b;
    }
LAB_001db3e2:
    if (out->v2rho2 != (double *)0x0) {
      if ((info->flags & 4) == 0) goto LAB_001db460;
      if (out->v2rhosigma == (double *)0x0) goto LAB_001db465;
      if (out->v2sigma2 != (double *)0x0) goto LAB_001db3fd;
      goto LAB_001db46f;
    }
LAB_001db3fd:
    if (out->v3rho3 != (double *)0x0) {
      if ((info->flags & 8) == 0) goto LAB_001db46a;
      if (out->v3rho2sigma == (double *)0x0) goto LAB_001db474;
      if (out->v3rhosigma2 == (double *)0x0) goto LAB_001db479;
      if (out->v3sigma3 != (double *)0x0) goto LAB_001db41f;
      goto LAB_001db483;
    }
LAB_001db41f:
    if (out->v4rho4 == (double *)0x0) {
      return;
    }
    if ((info->flags & 0x10) == 0) goto LAB_001db47e;
    if (out->v4rho3sigma == (double *)0x0) goto LAB_001db488;
    if (out->v4rho2sigma2 == (double *)0x0) goto LAB_001db48d;
    if (out->v4rhosigma3 != (double *)0x0) {
      if (out->v4sigma4 != (double *)0x0) {
        return;
      }
      goto LAB_001db497;
    }
  }
  else {
    info = (xc_func_info_type *)(ulong)(uint)order;
    xc_gga_sanity_check_cold_16();
LAB_001db451:
    xc_gga_sanity_check_cold_1();
LAB_001db456:
    xc_gga_sanity_check_cold_3();
LAB_001db45b:
    xc_gga_sanity_check_cold_2();
LAB_001db460:
    xc_gga_sanity_check_cold_6();
LAB_001db465:
    xc_gga_sanity_check_cold_5();
LAB_001db46a:
    xc_gga_sanity_check_cold_10();
LAB_001db46f:
    xc_gga_sanity_check_cold_4();
LAB_001db474:
    xc_gga_sanity_check_cold_9();
LAB_001db479:
    xc_gga_sanity_check_cold_8();
LAB_001db47e:
    xc_gga_sanity_check_cold_15();
LAB_001db483:
    xc_gga_sanity_check_cold_7();
LAB_001db488:
    xc_gga_sanity_check_cold_14();
LAB_001db48d:
    xc_gga_sanity_check_cold_13();
  }
  xc_gga_sanity_check_cold_12();
LAB_001db497:
  xc_gga_sanity_check_cold_11();
  if ((void *)*extraout_RDX != (void *)0x0) {
    memset((void *)*extraout_RDX,0,*(int *)&(info->ext_params).names * lVar2 * 8);
  }
  if ((void *)extraout_RDX[1] != (void *)0x0) {
    memset((void *)extraout_RDX[1],0,(long)*(int *)((long)&(info->ext_params).names + 4) * lVar2 * 8
          );
    memset((void *)extraout_RDX[2],0,(long)*(int *)&(info->ext_params).descriptions * lVar2 * 8);
  }
  if ((void *)extraout_RDX[3] != (void *)0x0) {
    lVar1 = lVar2 * 8;
    memset((void *)extraout_RDX[3],0,*(int *)((long)&(info->ext_params).values + 4) * lVar1);
    memset((void *)extraout_RDX[4],0,*(int *)&(info->ext_params).set * lVar1);
    memset((void *)extraout_RDX[5],0,*(int *)((long)&info->init + 4) * lVar1);
  }
  if ((void *)extraout_RDX[6] != (void *)0x0) {
    lVar1 = lVar2 * 8;
    memset((void *)extraout_RDX[6],0,*(int *)((long)&info->gga + 4) * lVar1);
    memset((void *)extraout_RDX[7],0,*(int *)&info->mgga * lVar1);
    memset((void *)extraout_RDX[8],0,info[1].kind * lVar1);
    memset((void *)extraout_RDX[9],0,*(int *)((long)info[1].refs + 4) * lVar1);
  }
  if ((void *)extraout_RDX[10] == (void *)0x0) {
    return;
  }
  lVar2 = lVar2 * 8;
  memset((void *)extraout_RDX[10],0,*(int *)&info[1].field_0x44 * lVar2);
  memset((void *)extraout_RDX[0xb],0,*(int *)&info[1].dens_threshold * lVar2);
  memset((void *)extraout_RDX[0xc],0,*(int *)&info[1].ext_params.field_0x4 * lVar2);
  memset((void *)extraout_RDX[0xd],0,*(int *)((long)&info[1].ext_params.values + 4) * lVar2);
  memset((void *)extraout_RDX[0xe],0,*(int *)((long)&info[1].gga + 4) * lVar2);
  return;
}

Assistant:

void
xc_gga_sanity_check(const xc_func_info_type *info, int order, xc_gga_out_params *out)
{
  /* sanity check */
  if(order < 0 || order > 4){
    fprintf(stderr, "Order of derivatives '%d' not implemented\n",
	    order);
    exit(1);
  }
  
  /* sanity check */
  if(out->zk != NULL && !(info->flags & XC_FLAGS_HAVE_EXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of Exc\n",
	    info->name);
    exit(1);
  }

  if(out->vrho != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_VXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of vxc\n",
              info->name);
      exit(1);
    }
    check_out_var(vsigma);
  }

  if(out->v2rho2 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_FXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of fxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v2rhosigma); 
    check_out_var(v2sigma2);
  }

  if(out->v3rho3){
    if(!(info->flags & XC_FLAGS_HAVE_KXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of kxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v3rho2sigma);
    check_out_var(v3rhosigma2);
    check_out_var(v3sigma3);
  }

  if(out->v4rho4 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_LXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of lxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v4rho3sigma);
    check_out_var(v4rho2sigma2);
    check_out_var(v4rhosigma3);
    check_out_var(v4sigma4);
  }
}